

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_file_storage::locked_file::locked_file
          (locked_file *this,session_file_storage *object,string *sid,bool create)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  byte in_CL;
  string *in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar4;
  stat s_name;
  stat s_id;
  int res;
  flock lock;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  __dev_t local_198;
  __ino_t local_190;
  string *in_stack_fffffffffffffe80;
  session_file_storage *in_stack_fffffffffffffe88;
  stat local_108;
  int local_74;
  undefined2 local_70;
  undefined2 local_6e;
  string local_40 [39];
  byte local_19;
  
  local_19 = in_CL & 1;
  *in_RDI = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  *(undefined4 *)(in_RDI + 5) = 0xffffffff;
  std::__cxx11::string::string((string *)(in_RDI + 6));
  file_name(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::string::operator=((string *)(in_RDI + 6),local_40);
  std::__cxx11::string::~string(local_40);
  session_file_storage::lock
            ((session_file_storage *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (string *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  while( true ) {
    while( true ) {
      if ((local_19 & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iVar1 = open(pcVar2,2);
        *(int *)(in_RDI + 5) = iVar1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iVar1 = open(pcVar2,0x42,0x1b6);
        *(int *)(in_RDI + 5) = iVar1;
      }
      if ((int)in_RDI[5] < 0) {
        return;
      }
      if ((*(byte *)(*in_RDI + 0x3c) & 1) == 0) {
        return;
      }
      memset(&local_70,0,0x20);
      local_70 = 1;
      local_6e = 0;
      do {
        local_74 = fcntl((int)in_RDI[5],7,&local_70);
        bVar4 = false;
        if (local_74 != 0) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
      if (local_74 < 0) {
        close((int)in_RDI[5]);
        *(undefined4 *)(in_RDI + 5) = 0xffffffff;
      }
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = stat(pcVar2,(stat *)&local_198);
      if (-1 < iVar1) break;
      close((int)in_RDI[5]);
      *(undefined4 *)(in_RDI + 5) = 0xffffffff;
    }
    iVar1 = fstat((int)in_RDI[5],&local_108);
    if (iVar1 < 0) {
      close((int)in_RDI[5]);
      *(undefined4 *)(in_RDI + 5) = 0xffffffff;
      return;
    }
    if ((local_108.st_ino == local_190) && (local_108.st_dev == local_198)) break;
    close((int)in_RDI[5]);
    *(undefined4 *)(in_RDI + 5) = 0xffffffff;
  }
  return;
}

Assistant:

locked_file(session_file_storage *object,std::string sid,bool create) :
		object_(object),
		sid_(sid),
		fd_(-1)
	{
		name_=object_->file_name(sid);
		object_->lock(sid_);
		for(;;) {
			if(create)
				fd_=::open(name_.c_str(),O_CREAT | O_RDWR,0666);
			else
				fd_=::open(name_.c_str(),O_RDWR);

			if(fd_ < 0) return;

			if(!object_->file_lock_)
				return;

			struct flock lock;
			memset(&lock,0,sizeof(lock));
			lock.l_type=F_WRLCK;
			lock.l_whence=SEEK_SET;
			int res;
			while((res=fcntl(fd_,F_SETLKW,&lock))!=0 && errno==EINTR)
				;
			if(res < 0) {
				::close(fd_);
				fd_=-1;
			}
			struct stat s_id,s_name;
			if(::stat(name_.c_str(),&s_name) < 0) {
				// looks like file was deleted
				::close(fd_);
				fd_=-1;
				continue;
			}
			if(::fstat(fd_,&s_id) < 0) {
				::close(fd_);
				fd_=-1;
				return;
			}
			if(s_id.st_ino!=s_name.st_ino || s_id.st_dev!=s_name.st_dev) {
				::close(fd_);
				fd_=-1;
				continue;
			}
			return;
		}

	}